

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_executor.cpp
# Opt level: O3

void __thiscall duckdb::TaskExecutor::WorkOnTasks(TaskExecutor *this)

{
  TaskScheduler *pTVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar2;
  type token;
  Task *pTVar3;
  ConcurrentQueue *this_01;
  shared_ptr<duckdb::Task,_true> task_from_producer;
  shared_ptr<duckdb::Task,_true> local_38;
  
  local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    pTVar1 = this->scheduler;
    token = unique_ptr<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>,_true>::
            operator*(&this->token);
    this_01 = (ConcurrentQueue *)&pTVar1->queue;
    unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>::
    operator->((unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
                *)this_01);
    bVar2 = ConcurrentQueue::DequeueFromProducer(this_01,token,&local_38);
    if (!bVar2) break;
    pTVar3 = shared_ptr<duckdb::Task,_true>::operator->(&local_38);
    (*pTVar3->_vptr_Task[2])(pTVar3,0);
    this_00._M_pi =
         local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_pi);
    }
  }
  do {
  } while ((this->completed_tasks).super___atomic_base<unsigned_long>._M_i !=
           (this->total_tasks).super___atomic_base<unsigned_long>._M_i);
  if (((this->error_manager).has_error._M_base._M_i & 1U) != 0) {
    TaskErrorManager::ThrowException(&this->error_manager);
  }
  if (local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void TaskExecutor::WorkOnTasks() {
	// repeatedly execute tasks until we are finished
	shared_ptr<Task> task_from_producer;
	while (scheduler.GetTaskFromProducer(*token, task_from_producer)) {
		auto res = task_from_producer->Execute(TaskExecutionMode::PROCESS_ALL);
		(void)res;
		D_ASSERT(res != TaskExecutionResult::TASK_BLOCKED);
		task_from_producer.reset();
	}
	// wait for all active tasks to finish
	while (completed_tasks != total_tasks) {
	}

	// check if we ran into any errors while checkpointing
	if (HasError()) {
		// throw the error
		ThrowError();
	}
}